

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O3

void __thiscall
FileTest_OpenBufferedFileError_Test::TestBody(FileTest_OpenBufferedFileError_Test *this)

{
  bool bVar1;
  char *message;
  string_view message_00;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertHelper AStack_58;
  file local_4c;
  AssertionResult local_48;
  string local_38;
  
  testing::AssertionSuccess();
  if (local_48.success_ == true) {
    message_00.size_ = 0x1c;
    message_00.data_ = "cannot open file nonexistent";
    format_system_error_abi_cxx11_(&local_38,2,message_00);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::file::file(&local_4c,(cstring_view)0x15b56c,0);
      fmt::v5::file::~file(&local_4c);
    }
    testing::AssertionResult::operator<<
              (&local_48,
               (char (*) [120])
               "Expected: file(\"nonexistent\", file::RDONLY) throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_38);
  if (local_48.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
             ,0xb6,message);
  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if ((((long *)local_38._M_dataplus._M_p != (long *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(FileTest, OpenBufferedFileError) {
  EXPECT_SYSTEM_ERROR(file("nonexistent", file::RDONLY),
      ENOENT, "cannot open file nonexistent");
}